

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O3

bool anon_unknown.dwarf_1795883::isUnionMemberType(Type *left,Type *right)

{
  bool bVar1;
  Type *pTVar2;
  Scope *this;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar3;
  Type *pTVar4;
  Type *rhs;
  FieldSymbol *field;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar5;
  
  pTVar4 = left->canonical;
  if (pTVar4 == (Type *)0x0) {
    slang::ast::Type::resolveCanonical(left);
    pTVar4 = left->canonical;
  }
  rhs = right->canonical;
  if (rhs == (Type *)0x0) {
    slang::ast::Type::resolveCanonical(right);
    rhs = right->canonical;
  }
  pTVar2 = pTVar4->canonical;
  if (pTVar2 == (Type *)0x0) {
    slang::ast::Type::resolveCanonical(pTVar4);
    pTVar2 = pTVar4->canonical;
  }
  if ((pTVar2->super_Symbol).kind == PackedUnionType) {
    this = slang::ast::Symbol::scopeOrNull(&pTVar4->super_Symbol);
    sVar5 = slang::ast::Scope::membersOfType<slang::ast::FieldSymbol>(this);
    sVar3 = sVar5._M_begin.current;
joined_r0x0041eb63:
    if (sVar3.current != sVar5._M_end.current.current) {
      pTVar4 = slang::ast::DeclaredType::getType((DeclaredType *)(sVar3.current + 1));
      bVar1 = slang::ast::Type::isMatching(pTVar4,rhs);
      if (bVar1) {
        return true;
      }
      bVar1 = isUnionMemberType(pTVar4,rhs);
      if (bVar1) {
        return true;
      }
      do {
        sVar3.current = (sVar3.current)->nextInScope;
        if (sVar3.current == (Symbol *)0x0) {
          sVar3.current = (Symbol *)0x0;
          break;
        }
      } while ((sVar3.current)->kind != Field);
      goto joined_r0x0041eb63;
    }
  }
  return false;
}

Assistant:

bool isUnionMemberType(const Type& left, const Type& right) {
    const Type& lt = left.getCanonicalType();
    const Type& rt = right.getCanonicalType();
    if (!lt.isPackedUnion())
        return false;

    for (auto& field : lt.as<Scope>().membersOfType<FieldSymbol>()) {
        auto& ft = field.getType();
        if (ft.isMatching(rt) || isUnionMemberType(ft, rt))
            return true;
    }
    return false;
}